

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

void Js::JavascriptString::GetThisAndSearchStringArguments
               (ArgumentReader *args,ScriptContext *scriptContext,char16 *apiNameForErrorMsg,
               JavascriptString **ppThis,JavascriptString **ppSearch,bool isRegExpAnAllowedArg)

{
  Type TVar1;
  bool bVar2;
  JavascriptLibrary *this;
  Var pvVar3;
  JavascriptString *local_50;
  JavascriptString *local_48;
  JavascriptString *pSearch;
  bool isRegExpAnAllowedArg_local;
  JavascriptString **ppSearch_local;
  JavascriptString **ppThis_local;
  char16 *apiNameForErrorMsg_local;
  ScriptContext *scriptContext_local;
  ArgumentReader *args_local;
  
  GetThisStringArgument(args,scriptContext,apiNameForErrorMsg,ppThis);
  this = ScriptContext::GetLibrary(scriptContext);
  local_48 = JavascriptLibrary::GetUndefinedDisplayString(this);
  TVar1 = (args->super_Arguments).Info;
  if ((TVar1._0_4_ & 0xffffff) != 1 && ((ulong)TVar1 & 0xffffff) != 0) {
    if (!isRegExpAnAllowedArg) {
      pvVar3 = Arguments::operator[](&args->super_Arguments,1);
      bVar2 = JavascriptRegExp::IsRegExpLike(pvVar3,scriptContext);
      if (bVar2) {
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5e9f8,apiNameForErrorMsg);
      }
    }
    pvVar3 = Arguments::operator[](&args->super_Arguments,1);
    bVar2 = VarIs<Js::JavascriptString>(pvVar3);
    if (bVar2) {
      local_50 = UnsafeVarTo<Js::JavascriptString>(pvVar3);
    }
    else {
      local_50 = (JavascriptString *)0x0;
    }
    local_48 = local_50;
    if (local_50 == (JavascriptString *)0x0) {
      pvVar3 = Arguments::operator[](&args->super_Arguments,1);
      local_48 = JavascriptConversion::ToString(pvVar3,scriptContext);
    }
  }
  *ppSearch = local_48;
  return;
}

Assistant:

void JavascriptString::GetThisAndSearchStringArguments(ArgumentReader& args, ScriptContext* scriptContext, const char16* apiNameForErrorMsg, JavascriptString** ppThis, JavascriptString** ppSearch, bool isRegExpAnAllowedArg)
    {
        GetThisStringArgument(args, scriptContext, apiNameForErrorMsg, ppThis);

        JavascriptString * pSearch = scriptContext->GetLibrary()->GetUndefinedDisplayString();
        if (args.Info.Count > 1)
        {
            if (!isRegExpAnAllowedArg && JavascriptRegExp::IsRegExpLike(args[1], scriptContext))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_FirstCannotBeRegExp, apiNameForErrorMsg);
            }
            else
            {
                pSearch = JavascriptOperators::TryFromVar<JavascriptString>(args[1]);
                if (!pSearch)
                {
                    pSearch = JavascriptConversion::ToString(args[1], scriptContext);
                }
            }
        }

        *ppSearch = pSearch;
    }